

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O1

void record_pipeline_flags2(StateRecorder *recorder)

{
  bool bVar1;
  Hash rt_hash [2];
  Hash compute_hash [2];
  Hash gfx_hash [2];
  VkComputePipelineCreateInfo compute_info;
  VkRayTracingPipelineCreateInfoKHR rt_info;
  VkPipelineCreateFlags2CreateInfoKHR flags2_info;
  VkGraphicsPipelineCreateInfo graphics_info;
  VkShaderModuleCreateInfo module_info;
  Hash local_1f8;
  Hash local_1f0;
  Hash local_1e8;
  Hash local_1e0;
  Hash local_1d8;
  Hash local_1d0;
  VkComputePipelineCreateInfo local_1c8;
  VkRayTracingPipelineCreateInfoKHR local_168;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  VkGraphicsPipelineCreateInfo local_d8;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  memset(&local_d8,0,0x90);
  local_d8.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_1c8.basePipelineHandle = (VkPipeline)0x0;
  local_1c8.basePipelineIndex = 0;
  local_1c8._92_4_ = 0;
  local_1c8.stage.pSpecializationInfo = (VkSpecializationInfo *)0x0;
  local_1c8.layout = (VkPipelineLayout)0x0;
  local_1c8.stage.module = (VkShaderModule)0x0;
  local_1c8.stage.flags = 0;
  local_1c8.stage.stage = 0;
  local_1c8.flags = 0;
  local_1c8._20_4_ = 0;
  local_1c8.stage.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_1c8.stage._4_4_ = 0;
  local_1c8.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_1c8._4_4_ = 0;
  local_168.basePipelineIndex = 0;
  local_168._100_4_ = 0;
  local_168.layout = (VkPipelineLayout)0x0;
  local_168.basePipelineHandle = (VkPipeline)0x0;
  local_168.pLibraryInterface = (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0;
  local_168.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_168.maxPipelineRayRecursionDepth = 0;
  local_168._52_4_ = 0;
  local_168.pLibraryInfo = (VkPipelineLibraryCreateInfoKHR *)0x0;
  local_168.groupCount = 0;
  local_168._36_4_ = 0;
  local_168.pGroups = (VkRayTracingShaderGroupCreateInfoKHR *)0x0;
  local_168.flags = 0;
  local_168.stageCount = 0;
  local_168.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  local_168.sType = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR;
  local_168._4_4_ = 0;
  local_1c8.pNext = &local_f8;
  local_e8 = 0;
  local_f8 = 0x3ba1f5f5;
  uStack_f0 = 0;
  local_1c8.stage.pNext = &local_48;
  uStack_40 = 0;
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0x10;
  local_1c8.stage.pName = "foo";
  local_168.pNext = local_1c8.pNext;
  local_d8.pNext = local_1c8.pNext;
  bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline(recorder,&local_d8,&local_1d8);
  if (bVar1) {
    local_d8.flags = 1;
    bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline(recorder,&local_d8,&local_1d0);
    if ((bVar1) && (local_1d8 == local_1d0)) {
      bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                        (recorder,(VkPipeline)&DAT_00000001,&local_d8,(VkPipeline *)0x0,0,0,
                         (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
      if (bVar1) {
        bVar1 = Fossilize::Hashing::compute_hash_compute_pipeline(recorder,&local_1c8,&local_1e8);
        if (bVar1) {
          local_1c8.flags = 1;
          bVar1 = Fossilize::Hashing::compute_hash_compute_pipeline(recorder,&local_1c8,&local_1e0);
          if ((bVar1) && (local_1e8 == local_1e0)) {
            bVar1 = Fossilize::StateRecorder::record_compute_pipeline
                              (recorder,(VkPipeline)&DAT_00000001,&local_1c8,(VkPipeline *)0x0,0,0,
                               (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
            if (bVar1) {
              bVar1 = Fossilize::Hashing::compute_hash_raytracing_pipeline
                                (recorder,&local_168,&local_1f8);
              if (bVar1) {
                local_168.flags = 1;
                bVar1 = Fossilize::Hashing::compute_hash_raytracing_pipeline
                                  (recorder,&local_168,&local_1f0);
                if ((bVar1) && (local_1f8 == local_1f0)) {
                  bVar1 = Fossilize::StateRecorder::record_raytracing_pipeline
                                    (recorder,(VkPipeline)&DAT_00000001,&local_168,(VkPipeline *)0x0
                                     ,0,0,(VkDevice)0x0,
                                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                  if (bVar1) {
                    local_e8 = 0x800003c0;
                    bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline
                                      (recorder,&local_d8,&local_1d0);
                    if (bVar1) {
                      bVar1 = Fossilize::Hashing::compute_hash_compute_pipeline
                                        (recorder,&local_1c8,&local_1e0);
                      if (bVar1) {
                        bVar1 = Fossilize::Hashing::compute_hash_raytracing_pipeline
                                          (recorder,&local_168,&local_1f0);
                        if (bVar1) {
                          bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                            (recorder,(VkPipeline)&DAT_00000001,&local_d8,
                                             (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                             (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                          if (bVar1) {
                            bVar1 = Fossilize::StateRecorder::record_compute_pipeline
                                              (recorder,(VkPipeline)&DAT_00000001,&local_1c8,
                                               (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                               (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                            if (bVar1) {
                              bVar1 = Fossilize::StateRecorder::record_raytracing_pipeline
                                                (recorder,(VkPipeline)&DAT_00000001,&local_168,
                                                 (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                                 (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                              if ((((bVar1) && (local_1d8 == local_1d0)) && (local_1e8 == local_1e0)
                                  ) && (local_1f8 == local_1f0)) {
                                local_e8 = local_e8 | 0x8000000000000000;
                                bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline
                                                  (recorder,&local_d8,&local_1d0);
                                if (bVar1) {
                                  bVar1 = Fossilize::Hashing::compute_hash_compute_pipeline
                                                    (recorder,&local_1c8,&local_1e0);
                                  if (bVar1) {
                                    bVar1 = Fossilize::Hashing::compute_hash_raytracing_pipeline
                                                      (recorder,&local_168,&local_1f0);
                                    if (bVar1) {
                                      bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                                        (recorder,(VkPipeline)&DAT_00000001,
                                                         &local_d8,(VkPipeline *)0x0,0,0,
                                                         (VkDevice)0x0,
                                                         (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                      if (bVar1) {
                                        bVar1 = Fossilize::StateRecorder::record_compute_pipeline
                                                          (recorder,(VkPipeline)&DAT_00000001,
                                                           &local_1c8,(VkPipeline *)0x0,0,0,
                                                           (VkDevice)0x0,
                                                           (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                        if (bVar1) {
                                          bVar1 = Fossilize::StateRecorder::
                                                  record_raytracing_pipeline
                                                            (recorder,(VkPipeline)&DAT_00000001,
                                                             &local_168,(VkPipeline *)0x0,0,0,
                                                             (VkDevice)0x0,
                                                             (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                          if (((bVar1) && (local_1d8 != local_1d0)) &&
                                             ((local_1e8 != local_1e0 && (local_1f8 != local_1f0))))
                                          {
                                            local_e8 = 0x8000000000000000;
                                            bVar1 = Fossilize::Hashing::
                                                    compute_hash_graphics_pipeline
                                                              (recorder,&local_d8,&local_1d8);
                                            if (bVar1) {
                                              bVar1 = Fossilize::Hashing::
                                                      compute_hash_compute_pipeline
                                                                (recorder,&local_1c8,&local_1e8);
                                              if (bVar1) {
                                                bVar1 = Fossilize::Hashing::
                                                        compute_hash_raytracing_pipeline
                                                                  (recorder,&local_168,&local_1f8);
                                                if (bVar1) {
                                                  bVar1 = Fossilize::StateRecorder::
                                                          record_graphics_pipeline
                                                                    (recorder,(VkPipeline)
                                                                              &DAT_00000001,
                                                                     &local_d8,(VkPipeline *)0x0,0,0
                                                                     ,(VkDevice)0x0,
                                                                     (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                                  if (bVar1) {
                                                    bVar1 = Fossilize::StateRecorder::
                                                            record_compute_pipeline
                                                                      (recorder,(VkPipeline)
                                                                                &DAT_00000001,
                                                                       &local_1c8,(VkPipeline *)0x0,
                                                                       0,0,(VkDevice)0x0,
                                                                       (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                                  if (bVar1) {
                                                    bVar1 = Fossilize::StateRecorder::
                                                            record_raytracing_pipeline
                                                                      (recorder,(VkPipeline)
                                                                                &DAT_00000001,
                                                                       &local_168,(VkPipeline *)0x0,
                                                                       0,0,(VkDevice)0x0,
                                                                       (
                                                  PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                                                  if (((bVar1) && (local_1d8 == local_1d0)) &&
                                                     ((local_1e8 == local_1e0 &&
                                                      (local_1f8 == local_1f0)))) {
                                                    return;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  abort();
}

Assistant:

static void record_pipeline_flags2(StateRecorder &recorder)
{
	VkGraphicsPipelineCreateInfo graphics_info = { VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO };
	VkComputePipelineCreateInfo compute_info = { VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO };
	VkRayTracingPipelineCreateInfoKHR rt_info = { VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR };
	VkPipelineCreateFlags2CreateInfoKHR flags2_info = { VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR };

	// To avoid compute hashing failing.
	VkShaderModuleCreateInfo module_info = { VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO };
	compute_info.stage.pNext = &module_info;
	compute_info.stage.pName = "foo";

	graphics_info.pNext = &flags2_info;
	compute_info.pNext = &flags2_info;
	rt_info.pNext = &flags2_info;

	Hash gfx_hash[2], compute_hash[2], rt_hash[2];

	// First, ensure that base flags is ignored when there is a pNext.
	if (!Hashing::compute_hash_graphics_pipeline(recorder, graphics_info, &gfx_hash[0]))
		abort();
	graphics_info.flags = 1;
	if (!Hashing::compute_hash_graphics_pipeline(recorder, graphics_info, &gfx_hash[1]))
		abort();
	if (gfx_hash[0] != gfx_hash[1])
		abort();
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(1), graphics_info, nullptr, 0))
		abort();

	if (!Hashing::compute_hash_compute_pipeline(recorder, compute_info, &compute_hash[0]))
		abort();
	compute_info.flags = 1;
	if (!Hashing::compute_hash_compute_pipeline(recorder, compute_info, &compute_hash[1]))
		abort();
	if (compute_hash[0] != compute_hash[1])
		abort();
	if (!recorder.record_compute_pipeline(fake_handle<VkPipeline>(1), compute_info, nullptr, 0))
		abort();

	if (!Hashing::compute_hash_raytracing_pipeline(recorder, rt_info, &rt_hash[0]))
		abort();
	rt_info.flags = 1;
	if (!Hashing::compute_hash_raytracing_pipeline(recorder, rt_info, &rt_hash[1]))
		abort();
	if (rt_hash[0] != rt_hash[1])
		abort();
	if (!recorder.record_raytracing_pipeline(fake_handle<VkPipeline>(1), rt_info, nullptr, 0))
		abort();

	// Ignored flags.
	flags2_info.flags =
			VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR |
			VK_PIPELINE_CREATE_EARLY_RETURN_ON_FAILURE_BIT_EXT |
			VK_PIPELINE_CREATE_FAIL_ON_PIPELINE_COMPILE_REQUIRED_BIT_EXT |
			VK_PIPELINE_CREATE_2_CAPTURE_DATA_BIT_KHR;
	if (!Hashing::compute_hash_graphics_pipeline(recorder, graphics_info, &gfx_hash[1]))
		abort();
	if (!Hashing::compute_hash_compute_pipeline(recorder, compute_info, &compute_hash[1]))
		abort();
	if (!Hashing::compute_hash_raytracing_pipeline(recorder, rt_info, &rt_hash[1]))
		abort();
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(1), graphics_info, nullptr, 0))
		abort();
	if (!recorder.record_compute_pipeline(fake_handle<VkPipeline>(1), compute_info, nullptr, 0))
		abort();
	if (!recorder.record_raytracing_pipeline(fake_handle<VkPipeline>(1), rt_info, nullptr, 0))
		abort();

	if (gfx_hash[0] != gfx_hash[1])
		abort();
	if (compute_hash[0] != compute_hash[1])
		abort();
	if (rt_hash[0] != rt_hash[1])
		abort();

	flags2_info.flags |= 1ull << 63;

	if (!Hashing::compute_hash_graphics_pipeline(recorder, graphics_info, &gfx_hash[1]))
		abort();
	if (!Hashing::compute_hash_compute_pipeline(recorder, compute_info, &compute_hash[1]))
		abort();
	if (!Hashing::compute_hash_raytracing_pipeline(recorder, rt_info, &rt_hash[1]))
		abort();
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(1), graphics_info, nullptr, 0))
		abort();
	if (!recorder.record_compute_pipeline(fake_handle<VkPipeline>(1), compute_info, nullptr, 0))
		abort();
	if (!recorder.record_raytracing_pipeline(fake_handle<VkPipeline>(1), rt_info, nullptr, 0))
		abort();

	if (gfx_hash[0] == gfx_hash[1])
		abort();
	if (compute_hash[0] == compute_hash[1])
		abort();
	if (rt_hash[0] == rt_hash[1])
		abort();

	flags2_info.flags = 1ull << 63;
	if (!Hashing::compute_hash_graphics_pipeline(recorder, graphics_info, &gfx_hash[0]))
		abort();
	if (!Hashing::compute_hash_compute_pipeline(recorder, compute_info, &compute_hash[0]))
		abort();
	if (!Hashing::compute_hash_raytracing_pipeline(recorder, rt_info, &rt_hash[0]))
		abort();
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(1), graphics_info, nullptr, 0))
		abort();
	if (!recorder.record_compute_pipeline(fake_handle<VkPipeline>(1), compute_info, nullptr, 0))
		abort();
	if (!recorder.record_raytracing_pipeline(fake_handle<VkPipeline>(1), rt_info, nullptr, 0))
		abort();

	if (gfx_hash[0] != gfx_hash[1])
		abort();
	if (compute_hash[0] != compute_hash[1])
		abort();
	if (rt_hash[0] != rt_hash[1])
		abort();
}